

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Duration.cpp
# Opt level: O3

bool __thiscall Duration::parse_designated(Duration *this,Pig *pig)

{
  bool bVar1;
  uint c;
  time_t in_RAX;
  size_type previous;
  size_type sVar2;
  longlong value;
  time_t local_28;
  
  local_28 = in_RAX;
  previous = Pig::cursor(pig);
  bVar1 = Pig::skip(pig,0x50);
  if ((bVar1) && (bVar1 = Pig::eos(pig), !bVar1)) {
    Pig::save(pig);
    bVar1 = Pig::getDigits(pig,&local_28);
    if ((bVar1) && (bVar1 = Pig::skip(pig,0x59), bVar1)) {
      this->_year = (int)local_28;
    }
    else {
      Pig::restore(pig);
    }
    Pig::save(pig);
    bVar1 = Pig::getDigits(pig,&local_28);
    if ((bVar1) && (bVar1 = Pig::skip(pig,0x4d), bVar1)) {
      this->_month = (int)local_28;
    }
    else {
      Pig::restore(pig);
    }
    Pig::save(pig);
    bVar1 = Pig::getDigits(pig,&local_28);
    if ((bVar1) && (bVar1 = Pig::skip(pig,0x44), bVar1)) {
      this->_day = (int)local_28;
    }
    else {
      Pig::restore(pig);
    }
    bVar1 = Pig::skip(pig,0x54);
    if ((bVar1) && (bVar1 = Pig::eos(pig), !bVar1)) {
      Pig::save(pig);
      bVar1 = Pig::getDigits(pig,&local_28);
      if ((bVar1) && (bVar1 = Pig::skip(pig,0x48), bVar1)) {
        this->_hours = (int)local_28;
      }
      else {
        Pig::restore(pig);
      }
      Pig::save(pig);
      bVar1 = Pig::getDigits(pig,&local_28);
      if ((bVar1) && (bVar1 = Pig::skip(pig,0x4d), bVar1)) {
        this->_minutes = (int)local_28;
      }
      else {
        Pig::restore(pig);
      }
      Pig::save(pig);
      bVar1 = Pig::getDigits(pig,&local_28);
      if ((bVar1) && (bVar1 = Pig::skip(pig,0x53), bVar1)) {
        this->_seconds = local_28;
      }
      else {
        Pig::restore(pig);
      }
    }
    c = Pig::peek(pig);
    sVar2 = Pig::cursor(pig);
    if (((2 < sVar2 - previous) && (bVar1 = unicodeLatinAlpha(c), !bVar1)) &&
       (bVar1 = unicodeLatinDigit(c), !bVar1)) {
      return true;
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Duration::parse_designated (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (pig.skip ('P') &&
      ! pig.eos ())
  {
    long long value;
    pig.save ();
    if (pig.getDigits (value) && pig.skip ('Y'))
      _year = value;
    else
      pig.restore ();

    pig.save ();
    if (pig.getDigits (value) && pig.skip ('M'))
      _month = value;
    else
      pig.restore ();

    pig.save ();
    if (pig.getDigits (value) && pig.skip ('D'))
      _day = value;
    else
      pig.restore ();

    if (pig.skip ('T') &&
        ! pig.eos ())
    {
      pig.save ();
      if (pig.getDigits (value) && pig.skip ('H'))
        _hours = value;
      else
        pig.restore ();

      pig.save ();
      if (pig.getDigits (value) && pig.skip ('M'))
        _minutes = value;
      else
        pig.restore ();

      pig.save ();
      if (pig.getDigits (value) && pig.skip ('S'))
        _seconds = value;
      else
        pig.restore ();
    }

    auto following = pig.peek ();
    if (pig.cursor () - checkpoint >= 3   &&
        ! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
      return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}